

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O1

void sGenXtrue(int n,int nrhs,float *x,int ldx)

{
  ulong uVar1;
  ulong uVar2;
  
  if (0 < nrhs) {
    uVar1 = 0;
    do {
      if (0 < n) {
        uVar2 = 0;
        do {
          x[uVar2] = 1.0;
          uVar2 = uVar2 + 1;
        } while ((uint)n != uVar2);
      }
      uVar1 = uVar1 + 1;
      x = x + ldx;
    } while (uVar1 != (uint)nrhs);
  }
  return;
}

Assistant:

void
sGenXtrue(int n, int nrhs, float *x, int ldx)
{
    int  i, j;
    for (j = 0; j < nrhs; ++j)
	for (i = 0; i < n; ++i) {
	    x[i + j*ldx] = 1.0;/* + (float)(i+1.)/n;*/
	}
}